

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashers.hpp
# Opt level: O1

bool __thiscall xercesc_4_0::StringHasher::equals(StringHasher *this,void *key1,void *key2)

{
  short sVar1;
  short sVar2;
  
  if (key1 == key2) {
    return true;
  }
  if (key2 == (void *)0x0 || key1 == (void *)0x0) {
    if (key1 == (void *)0x0) {
      if (key2 == (void *)0x0) {
        return true;
      }
    }
    else if (*key1 != 0 || key2 == (void *)0x0) {
      return *key1 == 0;
    }
  }
  else {
    while (sVar1 = *key1, sVar1 != 0) {
      key1 = (void *)((long)key1 + 2);
      sVar2 = *key2;
      key2 = (short *)((long)key2 + 2);
      if (sVar1 != sVar2) {
        return false;
      }
    }
  }
  return *key2 == 0;
}

Assistant:

bool equals(const void *const key1, const void *const key2) const
  {
    return XMLString::equals ((const XMLCh*)key1, (const XMLCh*)key2);
  }